

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O2

SW_FT_Error SW_FT_Stroker_EndSubPath(SW_FT_Stroker stroker)

{
  uint uVar1;
  SW_FT_UInt SVar2;
  SW_FT_Pos SVar3;
  byte *pbVar4;
  SW_FT_Angle SVar5;
  SW_FT_Vector *pSVar6;
  SW_FT_Int in_EDX;
  byte *extraout_RDX;
  byte *pbVar7;
  SW_FT_UInt new_points;
  SW_FT_Bool reverse;
  SW_FT_Vector *pSVar8;
  SW_FT_Vector *pSVar9;
  SW_FT_Vector *pSVar10;
  SW_FT_StrokeBorder border;
  uint uVar11;
  SW_FT_StrokeBorder right;
  
  if (stroker->subpath_open == '\0') {
    if (((stroker->center).x != (stroker->subpath_start).x) ||
       ((stroker->center).y != (stroker->subpath_start).y)) {
      SW_FT_Stroker_LineTo(stroker,&stroker->subpath_start);
    }
    stroker->angle_out = stroker->subpath_angle;
    SVar5 = SW_FT_Angle_Diff(stroker->angle_in,stroker->subpath_angle);
    if (SVar5 != 0) {
      uVar11 = (uint)((ulong)SVar5 >> 0x3f);
      ft_stroker_inside(stroker,uVar11,stroker->subpath_line_length);
      ft_stroker_outside(stroker,uVar11 ^ 1,stroker->subpath_line_length);
    }
    ft_stroke_border_close(stroker->borders,'\0');
    border = stroker->borders + 1;
    reverse = '\x01';
  }
  else {
    border = stroker->borders;
    ft_stroker_cap(stroker,stroker->angle_in,in_EDX);
    new_points = stroker->borders[1].num_points - stroker->borders[1].start;
    pbVar7 = extraout_RDX;
    if (0 < (int)new_points) {
      ft_stroke_border_grow(border,new_points);
      uVar11 = stroker->borders[0].num_points;
      uVar1 = stroker->borders[1].num_points;
      pSVar6 = stroker->borders[0].points + uVar11;
      pbVar4 = stroker->borders[0].tags + uVar11;
      pSVar10 = stroker->borders[1].points;
      pbVar7 = stroker->borders[1].tags + uVar1;
      pSVar9 = pSVar10 + uVar1;
      while( true ) {
        pbVar7 = pbVar7 + -1;
        pSVar8 = pSVar9 + -1;
        SVar2 = stroker->borders[1].start;
        if (pSVar8 < pSVar10 + (int)SVar2) break;
        SVar3 = pSVar9[-1].y;
        pSVar6->x = pSVar8->x;
        pSVar6->y = SVar3;
        *pbVar4 = *pbVar7 & 0xf3;
        pSVar6 = pSVar6 + 1;
        pbVar4 = pbVar4 + 1;
        pSVar10 = stroker->borders[1].points;
        pSVar9 = pSVar8;
      }
      stroker->borders[1].num_points = SVar2;
      stroker->borders[0].num_points = stroker->borders[0].num_points + new_points;
      stroker->borders[0].movable = '\0';
      stroker->borders[1].movable = '\0';
    }
    SVar3 = (stroker->subpath_start).y;
    (stroker->center).x = (stroker->subpath_start).x;
    (stroker->center).y = SVar3;
    ft_stroker_cap(stroker,stroker->subpath_angle + 0xb40000,(SW_FT_Int)pbVar7);
    reverse = '\0';
  }
  ft_stroke_border_close(border,reverse);
  return 0;
}

Assistant:

SW_FT_Error SW_FT_Stroker_EndSubPath(SW_FT_Stroker stroker)
{
    SW_FT_Error error = 0;

    if (stroker->subpath_open) {
        SW_FT_StrokeBorder right = stroker->borders;

        /* All right, this is an opened path, we need to add a cap between */
        /* right & left, add the reverse of left, then add a final cap     */
        /* between left & right.                                           */
        error = ft_stroker_cap(stroker, stroker->angle_in, 0);
        if (error) goto Exit;

        /* add reversed points from `left' to `right' */
        error = ft_stroker_add_reverse_left(stroker, TRUE);
        if (error) goto Exit;

        /* now add the final cap */
        stroker->center = stroker->subpath_start;
        error =
            ft_stroker_cap(stroker, stroker->subpath_angle + SW_FT_ANGLE_PI, 0);
        if (error) goto Exit;

        /* Now end the right subpath accordingly.  The left one is */
        /* rewind and doesn't need further processing.             */
        ft_stroke_border_close(right, FALSE);
    } else {
        SW_FT_Angle turn;
        SW_FT_Int   inside_side;

        /* close the path if needed */
        if (stroker->center.x != stroker->subpath_start.x ||
            stroker->center.y != stroker->subpath_start.y) {
            error = SW_FT_Stroker_LineTo(stroker, &stroker->subpath_start);
            if (error) goto Exit;
        }

        /* process the corner */
        stroker->angle_out = stroker->subpath_angle;
        turn = SW_FT_Angle_Diff(stroker->angle_in, stroker->angle_out);

        /* no specific corner processing is required if the turn is 0 */
        if (turn != 0) {
            /* when we turn to the right, the inside side is 0 */
            inside_side = 0;

            /* otherwise, the inside side is 1 */
            if (turn < 0) inside_side = 1;

            error = ft_stroker_inside(stroker, inside_side,
                                      stroker->subpath_line_length);
            if (error) goto Exit;

            /* process the outside side */
            error = ft_stroker_outside(stroker, 1 - inside_side,
                                       stroker->subpath_line_length);
            if (error) goto Exit;
        }

        /* then end our two subpaths */
        ft_stroke_border_close(stroker->borders + 0, FALSE);
        ft_stroke_border_close(stroker->borders + 1, TRUE);
    }

Exit:
    return error;
}